

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O3

int lws_ssl_capable_write(lws *wsi,uchar *buf,int len)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    iVar1 = lws_ssl_capable_write_no_ssl(wsi,buf,len);
    return iVar1;
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  ERR_clear_error();
  iVar1 = SSL_write((SSL *)(wsi->tls).ssl,buf,len);
  if (0 < iVar1) {
    return iVar1;
  }
  iVar1 = lws_ssl_get_error(wsi,iVar1);
  if (iVar1 != 2) {
    if (iVar1 == 5) {
LAB_00128675:
      pcVar4 = ERR_error_string((long)iVar1,(char *)0x0);
      _lws_log(0x10,"%s failed: %s\n","lws_ssl_capable_write",pcVar4);
      lws_tls_err_describe_clear();
      wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
      return -1;
    }
    iVar2 = SSL_want((SSL *)(wsi->tls).ssl);
    if (iVar2 != 3) {
      if ((iVar1 != 3) && (iVar2 = SSL_want((SSL *)(wsi->tls).ssl), iVar2 != 2)) goto LAB_00128675;
      pcVar4 = "%s: want write\n";
      iVar1 = 0x10;
      goto LAB_001286e4;
    }
  }
  pcVar4 = "%s: want read\n";
  iVar1 = 4;
LAB_001286e4:
  _lws_log(iVar1,pcVar4,"lws_ssl_capable_write");
  return -4;
}

Assistant:

int
lws_ssl_capable_write(struct lws *wsi, unsigned char *buf, int len)
{
	int n, m;

	// lwsl_notice("%s: len %d\n", __func__, len);
	// lwsl_hexdump_notice(buf, len);

	if (!wsi->tls.ssl)
		return lws_ssl_capable_write_no_ssl(wsi, buf, len);

	errno = 0;
	ERR_clear_error();
	n = SSL_write(wsi->tls.ssl, buf, len);
	if (n > 0)
		return n;

	m = lws_ssl_get_error(wsi, n);
	if (m != SSL_ERROR_SYSCALL) {
		if (m == SSL_ERROR_WANT_READ || SSL_want_read(wsi->tls.ssl)) {
			lwsl_notice("%s: want read\n", __func__);

			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}

		if (m == SSL_ERROR_WANT_WRITE || SSL_want_write(wsi->tls.ssl)) {
			lws_set_blocking_send(wsi);

			lwsl_debug("%s: want write\n", __func__);

			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}
	}

	lwsl_debug("%s failed: %s\n",__func__, ERR_error_string(m, NULL));
	lws_tls_err_describe_clear();

	wsi->socket_is_permanently_unusable = 1;

	return LWS_SSL_CAPABLE_ERROR;
}